

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O2

void secp256k1_scalar_inverse(secp256k1_scalar *r,secp256k1_scalar *x)

{
  secp256k1_modinv64_signed62 s;
  secp256k1_modinv64_signed62 sStack_38;
  
  secp256k1_scalar_to_signed62(&sStack_38,x);
  secp256k1_modinv64(&sStack_38,&secp256k1_const_modinfo_scalar);
  secp256k1_scalar_from_signed62(r,&sStack_38);
  return;
}

Assistant:

static void secp256k1_scalar_inverse(secp256k1_scalar *r, const secp256k1_scalar *x) {
    secp256k1_modinv64_signed62 s;
#ifdef VERIFY
    int zero_in = secp256k1_scalar_is_zero(x);
#endif
    SECP256K1_SCALAR_VERIFY(x);

    secp256k1_scalar_to_signed62(&s, x);
    secp256k1_modinv64(&s, &secp256k1_const_modinfo_scalar);
    secp256k1_scalar_from_signed62(r, &s);

    SECP256K1_SCALAR_VERIFY(r);
    VERIFY_CHECK(secp256k1_scalar_is_zero(r) == zero_in);
}